

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManSetLutRefs(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pObj;
  int iVar3;
  long lVar4;
  
  free(p->pLutRefs);
  piVar2 = (int *)calloc((long)p->nObjs,4);
  p->pLutRefs = piVar2;
  for (iVar3 = 0; iVar3 < p->vCos->nSize; iVar3 = iVar3 + 1) {
    pObj = Gia_ManCo(p,iVar3);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    Gia_ObjLutRefIncId(p,iVar1);
  }
  for (iVar3 = 1; iVar3 < p->nObjs; iVar3 = iVar3 + 1) {
    iVar1 = Gia_ObjIsLut(p,iVar3);
    if (iVar1 != 0) {
      lVar4 = 0;
      while( true ) {
        iVar1 = Gia_ObjLutSize(p,iVar3);
        if (iVar1 <= lVar4) break;
        piVar2 = Gia_ObjLutFanins(p,iVar3);
        Gia_ObjLutRefIncId(p,piVar2[lVar4]);
        lVar4 = lVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void Gia_ManSetLutRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i, k, iFan;
    ABC_FREE( p->pLutRefs );
    p->pLutRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjLutRefIncId( p, Gia_ObjFaninId0p(p, pObj) );
    Gia_ManForEachLut( p, i )
        Gia_LutForEachFanin( p, i, iFan, k )
            Gia_ObjLutRefIncId( p, iFan );
}